

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O2

void __thiscall tcmalloc::StringGenericWriter::~StringGenericWriter(StringGenericWriter *this)

{
  (this->super_GenericWriter)._vptr_GenericWriter = (_func_int **)&PTR__StringGenericWriter_001409e8
  ;
  GenericWriter::FinalRecycle(&this->super_GenericWriter);
  if (this->unused_size_ != 0) {
    std::__cxx11::string::resize((ulong)this->s_);
  }
  (this->super_GenericWriter)._vptr_GenericWriter = (_func_int **)&PTR__GenericWriter_001409c0;
  return;
}

Assistant:

StringGenericWriter::~StringGenericWriter() {
  FinalRecycle();
  if (unused_size_) {
    s_->resize(s_->size() - unused_size_);
  }
}